

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_init(archive_write *a,isofile *file)

{
  int iVar1;
  int64_t iVar2;
  ulong __size;
  void *pvVar3;
  long lVar4;
  archive_write *in_RSI;
  archive *in_RDI;
  int r;
  size_t bpsize;
  size_t _ceil;
  uint64_t tsize;
  iso9660_conflict *iso9660;
  archive_write *in_stack_ffffffffffffffc8;
  size_t size;
  int local_4;
  
  size = *(size_t *)&in_RDI[1].current_codepage;
  *(byte *)(size + 0x1d8) = *(byte *)(size + 0x1d8) & 0xfe;
  *(byte *)(size + 0x1d8) = *(byte *)(size + 0x1d8) & 0xfd;
  if (((*(uint *)(size + 0x10370) >> 0x17 & 3) == 0) ||
     ((*(uint *)(size + 0x10370) >> 0x1a & 1) == 0)) {
    local_4 = 0;
  }
  else {
    iVar2 = archive_entry_size(*(archive_entry **)&(in_RSI->archive).compression_code);
    if ((0x17 < iVar2) &&
       (iVar2 = archive_entry_size(*(archive_entry **)&(in_RSI->archive).compression_code),
       iVar2 < 0x100000000)) {
      *(byte *)(size + 0x1d8) = *(byte *)(size + 0x1d8) & 0xfe | 1;
      *(undefined4 *)(size + 0x21c) = 0;
    }
    if ((char)(*(char *)(size + 0x1d8) << 7) < '\0') {
      iVar2 = archive_entry_size(*(archive_entry **)&(in_RSI->archive).compression_code);
      if (iVar2 < 0x801) {
        local_4 = 0;
      }
      else {
        iVar1 = zisofs_init_zstream(in_stack_ffffffffffffffc8);
        if (iVar1 == 0) {
          *(undefined1 *)&in_RSI->filter_first = 4;
          *(undefined1 *)((long)&in_RSI->filter_first + 1) = 0xf;
          iVar2 = archive_entry_size(*(archive_entry **)&(in_RSI->archive).compression_code);
          *(int *)((long)&in_RSI->filter_first + 4) = (int)iVar2;
          *(int *)(size + 0x230) =
               (int)((ulong)*(uint *)((long)&in_RSI->filter_first + 4) + 0x7fff >>
                    (*(byte *)((long)&in_RSI->filter_first + 1) & 0x3f)) + 1;
          *(undefined4 *)(size + 0x234) = 0;
          __size = (long)*(int *)(size + 0x230) << 2;
          if (*(ulong *)(size + 0x228) < __size) {
            free(*(void **)(size + 0x220));
            pvVar3 = malloc(__size);
            *(void **)(size + 0x220) = pvVar3;
            if (*(long *)(size + 0x220) == 0) {
              archive_set_error(in_RDI,0xc,"Can\'t allocate data");
              return -0x1e;
            }
            *(ulong *)(size + 0x228) = __size;
          }
          lVar4 = __size + 0x10;
          iVar1 = write_null(in_RSI,size);
          if (iVar1 == 0) {
            archive_le32enc(*(void **)(size + 0x220),(uint32_t)lVar4);
            *(ulong *)(size + 0x2c0) = (ulong)*(uint *)((long)&in_RSI->filter_first + 4);
            *(byte *)(size + 0x1d8) = *(byte *)(size + 0x1d8) & 0xfd | 2;
            *(byte *)(size + 0x1d8) = *(byte *)(size + 0x1d8) & 0xfb | 4;
            *(long *)(size + 0x240) = lVar4;
            *(long *)(size + 0x238) = lVar4;
            *(long *)(*(long *)(*(long *)(size + 0x10) + 0xb0) + 8) = lVar4;
            local_4 = 0;
          }
          else {
            local_4 = -0x1e;
          }
        }
        else {
          local_4 = -0x1e;
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
zisofs_init(struct archive_write *a,  struct isofile *file)
{
	struct iso9660 *iso9660 = a->format_data;
#ifdef HAVE_ZLIB_H
	uint64_t tsize;
	size_t _ceil, bpsize;
	int r;
#endif

	iso9660->zisofs.detect_magic = 0;
	iso9660->zisofs.making = 0;

	if (!iso9660->opt.rr || !iso9660->opt.zisofs)
		return (ARCHIVE_OK);

	if (archive_entry_size(file->entry) >= 24 &&
	    archive_entry_size(file->entry) < MULTI_EXTENT_SIZE) {
		/* Acceptable file size for zisofs. */
		iso9660->zisofs.detect_magic = 1;
		iso9660->zisofs.magic_cnt = 0;
	}
	if (!iso9660->zisofs.detect_magic)
		return (ARCHIVE_OK);

#ifdef HAVE_ZLIB_H
	/* The number of Logical Blocks which uncompressed data
	 * will use in iso-image file is the same as the number of
	 * Logical Blocks which zisofs(compressed) data will use
	 * in ISO-image file. It won't reduce iso-image file size. */
	if (archive_entry_size(file->entry) <= LOGICAL_BLOCK_SIZE)
		return (ARCHIVE_OK);

	/* Initialize compression library */
	r = zisofs_init_zstream(a);
	if (r != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Mark file->zisofs to create RRIP 'ZF' Use Entry. */
	file->zisofs.header_size = ZF_HEADER_SIZE >> 2;
	file->zisofs.log2_bs = ZF_LOG2_BS;
	file->zisofs.uncompressed_size =
		(uint32_t)archive_entry_size(file->entry);

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (file->zisofs.uncompressed_size + ZF_BLOCK_SIZE -1)
		>> file->zisofs.log2_bs;
	iso9660->zisofs.block_pointers_cnt = (int)_ceil + 1;
	iso9660->zisofs.block_pointers_idx = 0;

	/* Ensure a buffer size used for Block Pointers */
	bpsize = iso9660->zisofs.block_pointers_cnt *
	    sizeof(iso9660->zisofs.block_pointers[0]);
	if (iso9660->zisofs.block_pointers_allocated < bpsize) {
		free(iso9660->zisofs.block_pointers);
		iso9660->zisofs.block_pointers = malloc(bpsize);
		if (iso9660->zisofs.block_pointers == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate data");
			return (ARCHIVE_FATAL);
		}
		iso9660->zisofs.block_pointers_allocated = bpsize;
	}

	/*
	 * Skip zisofs header and Block Pointers, which we will write
	 * after all compressed data of a file written to the temporary
	 * file.
	 */
	tsize = ZF_HEADER_SIZE + bpsize;
	if (write_null(a, (size_t)tsize) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Initialize some variables to make zisofs.
	 */
	archive_le32enc(&(iso9660->zisofs.block_pointers[0]),
		(uint32_t)tsize);
	iso9660->zisofs.remaining = file->zisofs.uncompressed_size;
	iso9660->zisofs.making = 1;
	iso9660->zisofs.allzero = 1;
	iso9660->zisofs.block_offset = tsize;
	iso9660->zisofs.total_size = tsize;
	iso9660->cur_file->cur_content->size = tsize;
#endif

	return (ARCHIVE_OK);
}